

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plurrule.cpp
# Opt level: O3

UBool __thiscall icu_63::PluralRules::isKeyword(PluralRules *this,UnicodeString *keyword)

{
  short sVar1;
  int8_t iVar2;
  RuleChain *pRVar3;
  int32_t length;
  bool bVar4;
  
  sVar1 = (keyword->fUnion).fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    length = (keyword->fUnion).fFields.fLength;
  }
  else {
    length = (int)sVar1 >> 5;
  }
  iVar2 = UnicodeString::doCompare(keyword,0,length,(UChar *)PLURAL_KEYWORD_OTHER,0,5);
  if (iVar2 == '\0') {
    bVar4 = true;
  }
  else {
    pRVar3 = rulesForKeyword(this,keyword);
    bVar4 = pRVar3 != (RuleChain *)0x0;
  }
  return bVar4;
}

Assistant:

UBool
PluralRules::isKeyword(const UnicodeString& keyword) const {
    if (0 == keyword.compare(PLURAL_KEYWORD_OTHER, 5)) {
        return true;
    }
    return rulesForKeyword(keyword) != nullptr;
}